

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::Equals,false,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  int iVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  sel_t sVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  idx_t iVar19;
  bool bVar20;
  
  if (count + 0x3f < 0x40) {
    iVar19 = 0;
  }
  else {
    puVar3 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar19 = 0;
    lVar14 = 0;
    uVar10 = 0;
    uVar15 = 0;
    do {
      if (puVar3 == (unsigned_long *)0x0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = puVar3[uVar10];
      }
      uVar17 = uVar15 + 0x40;
      if (count <= uVar15 + 0x40) {
        uVar17 = count;
      }
      uVar12 = uVar15;
      if (uVar9 == 0xffffffffffffffff) {
        if (uVar15 < uVar17) {
          psVar4 = sel->sel_vector;
          psVar5 = true_sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          uVar9 = uVar15 << 4 | 8;
          do {
            uVar12 = uVar15;
            if (psVar4 != (sel_t *)0x0) {
              uVar12 = (ulong)psVar4[uVar15];
            }
            iVar1 = *(int *)((long)ldata + (uVar9 - 8));
            iVar2 = *(int *)((long)rdata + (uVar9 - 8));
            if (((iVar1 != iVar2) ||
                (*(int *)((long)ldata + (uVar9 - 4)) != *(int *)((long)rdata + (uVar9 - 4)))) ||
               (bVar20 = true,
               *(long *)((long)&ldata->months + uVar9) != *(long *)((long)&rdata->months + uVar9)))
            {
              lVar7 = *(long *)((long)&ldata->months + uVar9);
              lVar18 = (long)*(int *)((long)ldata + (uVar9 - 4)) + lVar7 / 86400000000;
              lVar8 = *(long *)((long)&rdata->months + uVar9);
              lVar11 = (long)*(int *)((long)rdata + (uVar9 - 4)) + lVar8 / 86400000000;
              bVar20 = false;
              if (((long)iVar1 + lVar18 / 0x1e == (long)iVar2 + lVar11 / 0x1e) &&
                 (bVar20 = false, lVar18 % 0x1e == lVar11 % 0x1e)) {
                bVar20 = lVar7 % 86400000000 == lVar8 % 86400000000;
              }
            }
            psVar5[iVar19] = (sel_t)uVar12;
            iVar19 = iVar19 + bVar20;
            psVar6[lVar14] = (sel_t)uVar12;
            lVar14 = lVar14 + (ulong)(bVar20 ^ 1);
            uVar15 = uVar15 + 1;
            uVar9 = uVar9 + 0x10;
            uVar12 = uVar15;
          } while (uVar17 != uVar15);
        }
      }
      else if (uVar9 == 0) {
        uVar12 = uVar17;
        if (uVar15 < uVar17) {
          psVar4 = sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          do {
            sVar13 = (sel_t)uVar15;
            if (psVar4 != (sel_t *)0x0) {
              sVar13 = psVar4[uVar15];
            }
            psVar5[lVar14] = sVar13;
            lVar14 = lVar14 + 1;
            uVar15 = uVar15 + 1;
          } while (uVar17 != uVar15);
        }
      }
      else if (uVar15 < uVar17) {
        psVar4 = sel->sel_vector;
        psVar5 = true_sel->sel_vector;
        psVar6 = false_sel->sel_vector;
        uVar12 = uVar15 << 4 | 8;
        uVar16 = 0;
        do {
          if (psVar4 == (sel_t *)0x0) {
            sVar13 = (int)uVar15 + (int)uVar16;
          }
          else {
            sVar13 = psVar4[uVar15 + uVar16];
          }
          if ((uVar9 >> (uVar16 & 0x3f) & 1) == 0) {
            bVar20 = false;
          }
          else {
            iVar1 = *(int *)((long)ldata + (uVar12 - 8));
            iVar2 = *(int *)((long)rdata + (uVar12 - 8));
            if (((iVar1 != iVar2) ||
                (*(int *)((long)ldata + (uVar12 - 4)) != *(int *)((long)rdata + (uVar12 - 4)))) ||
               (bVar20 = true,
               *(long *)((long)&ldata->months + uVar12) != *(long *)((long)&rdata->months + uVar12))
               ) {
              lVar7 = *(long *)((long)&ldata->months + uVar12);
              lVar18 = (long)*(int *)((long)ldata + (uVar12 - 4)) + lVar7 / 86400000000;
              lVar8 = *(long *)((long)&rdata->months + uVar12);
              lVar11 = (long)*(int *)((long)rdata + (uVar12 - 4)) + lVar8 / 86400000000;
              bVar20 = false;
              if (((long)iVar1 + lVar18 / 0x1e == (long)iVar2 + lVar11 / 0x1e) &&
                 (bVar20 = false, lVar18 % 0x1e == lVar11 % 0x1e)) {
                bVar20 = lVar7 % 86400000000 == lVar8 % 86400000000;
              }
            }
          }
          psVar5[iVar19] = sVar13;
          iVar19 = iVar19 + bVar20;
          psVar6[lVar14] = sVar13;
          lVar14 = (ulong)(bVar20 ^ 1) + lVar14;
          uVar16 = uVar16 + 1;
          uVar12 = uVar12 + 0x10;
        } while ((uVar15 - uVar17) + uVar16 != 0);
        uVar12 = uVar15 + uVar16;
      }
      uVar10 = uVar10 + 1;
      uVar15 = uVar12;
    } while (uVar10 != count + 0x3f >> 6);
  }
  return iVar19;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}